

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_fxsub(sexp ctx,sexp a,sexp_uint_t b)

{
  undefined1 *puVar1;
  sexp *ppsVar2;
  undefined1 *puVar3;
  bool bVar4;
  
  ppsVar2 = &(a->value).type.slots;
  puVar1 = (undefined1 *)((long)&((a->value).type.cpl)->tag + 2);
  do {
    puVar3 = puVar1;
    if (puVar3 == (undefined1 *)0x3) {
      puVar3 = (undefined1 *)0x1;
      goto LAB_00119112;
    }
    puVar1 = puVar3 + -1;
  } while (*(long *)(&a->tag + (long)puVar3 * 2) == 0);
  puVar3 = puVar3 + -2;
LAB_00119112:
  if ((puVar3 == (undefined1 *)0x1) && (*ppsVar2 <= b && (sexp)(b - (long)*ppsVar2) != (sexp)0x0)) {
    (a->value).type.slots = (sexp)(b - (long)*ppsVar2);
    (a->value).flonum_bits[0] = -(a->value).flonum_bits[0];
    return a;
  }
  if (b != 0) {
    do {
      bVar4 = *ppsVar2 < b;
      *ppsVar2 = (sexp)((long)*ppsVar2 - b);
      ppsVar2 = ppsVar2 + 1;
      b = (sexp_uint_t)bVar4;
    } while (bVar4);
  }
  return a;
}

Assistant:

sexp sexp_bignum_fxsub (sexp ctx, sexp a, sexp_uint_t b) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), borrow, i=0, n;
  if ((len == 1) && (b > data[0])) {
    data[0] = b - data[0];
    sexp_bignum_sign(a) = -sexp_bignum_sign(a);
  } else {
    for (borrow=b; borrow; i++) {
      n = data[i];
      data[i] -= borrow;
      borrow = (n < borrow);
    }
  }
  return a;
}